

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_midiout.cpp
# Opt level: O3

void __thiscall MUSSong2::MUSSong2(MUSSong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  MUSHeader *pMVar5;
  undefined4 extraout_var_00;
  int i;
  long lVar6;
  BYTE front [32];
  char local_58 [40];
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MUSSong2_006f03f8;
  this->MusHeader = (MUSHeader *)0x0;
  this->MusBuffer = (BYTE *)0x0;
  iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,local_58,0x20);
  if (CONCAT44(extraout_var,iVar3) == 0x20) {
    iVar3 = 0;
    lVar6 = 0;
    do {
      if ((((local_58[lVar6] == 'M') && (local_58[lVar6 + 1] == 'U')) &&
          (local_58[lVar6 + 2] == 'S')) && (local_58[lVar6 + 3] == '\x1a')) {
        iVar2 = (int)reader->Length;
        uVar4 = iVar2 - (int)lVar6;
        if ((int)uVar4 < 8) {
          return;
        }
        pMVar5 = (MUSHeader *)operator_new__((ulong)uVar4);
        this->MusHeader = pMVar5;
        memcpy(pMVar5,local_58 + lVar6,0x20U - lVar6);
        iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (reader,(0x20U - lVar6) + (long)pMVar5,
                           (ulong)(uint)(iVar3 + iVar2) + lVar6 + -0x20);
        if (CONCAT44(extraout_var_00,iVar3) != (long)(iVar2 + -0x20)) {
          return;
        }
        pMVar5 = this->MusHeader;
        if (0xf < pMVar5->NumChans) {
          return;
        }
        uVar1 = pMVar5->SongStart;
        this->MusBuffer = (BYTE *)((long)&pMVar5->Magic + (ulong)uVar1);
        uVar4 = (iVar2 - (uint)uVar1) - (int)lVar6;
        if ((int)(uint)pMVar5->SongLen < (int)uVar4) {
          uVar4 = (uint)pMVar5->SongLen;
        }
        this->MaxMusP = (long)(int)uVar4;
        (this->super_MIDIStreamer).Division = 0x8c;
        (this->super_MIDIStreamer).InitialTempo = 1000000;
        return;
      }
      lVar6 = lVar6 + 1;
      iVar3 = iVar3 + -1;
    } while (lVar6 != 0x1d);
  }
  return;
}

Assistant:

MUSSong2::MUSSong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), MusBuffer(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif

	BYTE front[32];
	int start;

	if (reader.Read(front, sizeof(front)) != sizeof(front))
	{
		return;
	}

	// To tolerate sloppy wads (diescum.wad, I'm looking at you), we search
	// the first 32 bytes of the file for a signature. My guess is that DMX
	// does no validation whatsoever and just assumes it was passed a valid
	// MUS file, since where the header is offset affects how it plays.
	start = MUSHeaderSearch(front, sizeof(front));
	if (start < 0)
	{
		return;
	}

	// Read the remainder of the song.
	int len = int(reader.GetLength() - start);
	if (len < (int)sizeof(MusHeader))
	{ // It's too short.
		return;
	}
	MusHeader = (MUSHeader *)new BYTE[len];
    memcpy(MusHeader, front + start, sizeof(front) - start);
    if (reader.Read((BYTE *)MusHeader + sizeof(front) - start, len - (sizeof(front) - start)) != (len - (32 - start)))
    {
        return;
    }

	// Do some validation of the MUS file.
	if (LittleShort(MusHeader->NumChans) > 15)
	{
		return;
	}

	MusBuffer = (BYTE *)MusHeader + LittleShort(MusHeader->SongStart);
	MaxMusP = MIN<int>(LittleShort(MusHeader->SongLen), len - LittleShort(MusHeader->SongStart));
	Division = 140;
	InitialTempo = 1000000;
}